

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_convert(uchar *out,uchar *in,LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,
                    uint w,uint h)

{
  undefined2 uVar1;
  uchar *puVar2;
  undefined1 auVar3 [16];
  sbyte sVar4;
  bool bVar5;
  uchar uVar6;
  unsigned_short grey;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  uchar uVar10;
  undefined8 extraout_RAX;
  uchar uVar14;
  size_t sVar12;
  LodePNGColorMode *pLVar13;
  unsigned_short *a_00;
  byte bVar15;
  uint has_alpha;
  uchar uVar16;
  undefined8 extraout_RDX;
  ulong uVar17;
  long lVar18;
  unsigned_short *r_00;
  ulong uVar19;
  ColorTree *i;
  ColorTree *pCVar20;
  bool bVar21;
  unsigned_short a;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  ColorTree tree;
  unsigned_short local_d8;
  unsigned_short local_d6;
  unsigned_short local_d4;
  unsigned_short local_d2;
  uchar *local_d0;
  ColorTree *local_c8;
  LodePNGColorMode *local_c0;
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  int local_38;
  uchar uVar11;
  
  iVar7 = lodepng_color_mode_equal(mode_out,mode_in);
  if (iVar7 == 0) {
    local_c8 = (ColorTree *)(ulong)(h * w);
    pCVar20 = local_c8;
    local_d0 = out;
    local_c0 = mode_in;
    if (mode_out->colortype == LCT_PALETTE) {
      uVar19 = mode_out->palettesize;
      uVar17 = 1L << ((ulong)(byte)mode_out->bitdepth & 0x3f);
      pLVar13 = mode_out;
      if (uVar19 == 0) {
        uVar19 = mode_in->palettesize;
        pLVar13 = mode_in;
      }
      puVar2 = pLVar13->palette;
      if (uVar19 < uVar17) {
        uVar17 = uVar19;
      }
      local_78 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
      local_b8 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
      local_38 = -1;
      if (uVar19 != 0) {
        uVar19 = 0;
        pCVar20 = (ColorTree *)local_b8;
        do {
          color_tree_add(pCVar20,puVar2[uVar19 * 4],puVar2[uVar19 * 4 + 1],puVar2[uVar19 * 4 + 2],
                         puVar2[uVar19 * 4 + 3],(uint)uVar19);
          uVar19 = uVar19 + 1;
        } while (uVar17 != uVar19);
      }
    }
    uVar8 = (uint)pCVar20;
    if ((local_c0->bitdepth == 0x10) && (mode_out->bitdepth == 0x10)) {
      if (local_c8 != (ColorTree *)0x0) {
        lVar18 = 0;
        pCVar20 = (ColorTree *)0x0;
        do {
          local_d2 = 0;
          local_d4 = 0;
          local_d6 = 0;
          local_d8 = 0;
          getPixelColorRGBA16(&local_d2,&local_d4,&local_d6,&local_d8,in,(size_t)pCVar20,local_c0);
          uVar6 = (uchar)local_d2;
          uVar10 = (uchar)(local_d2 >> 8);
          uVar14 = (uchar)(local_d8 >> 8);
          uVar16 = (uchar)(local_d4 >> 8);
          uVar11 = (uchar)(local_d6 >> 8);
          switch(mode_out->colortype) {
          case LCT_GREY:
            uVar1 = swap_bytes(local_d2);
            *(undefined2 *)(local_d0 + (long)pCVar20 * 2) = uVar1;
            break;
          case LCT_RGB:
            local_d0[lVar18] = uVar10;
            local_d0[lVar18 + 1] = uVar6;
            local_d0[lVar18 + 2] = uVar16;
            local_d0[lVar18 + 3] = (uchar)local_d4;
            local_d0[lVar18 + 4] = uVar11;
            local_d0[lVar18 + 5] = (uchar)local_d6;
            break;
          case LCT_GREY_ALPHA:
            local_d0[(long)pCVar20 * 4] = uVar10;
            local_d0[(long)pCVar20 * 4 + 1] = uVar6;
            local_d0[(long)pCVar20 * 4 + 2] = uVar14;
            local_d0[(long)pCVar20 * 4 + 3] = (uchar)local_d8;
            break;
          case LCT_RGBA:
            local_d0[(long)pCVar20 * 8] = uVar10;
            local_d0[(long)pCVar20 * 8 + 1] = uVar6;
            local_d0[(long)pCVar20 * 8 + 2] = uVar16;
            local_d0[(long)pCVar20 * 8 + 3] = (uchar)local_d4;
            local_d0[(long)pCVar20 * 8 + 4] = uVar11;
            local_d0[(long)pCVar20 * 8 + 5] = (uchar)local_d6;
            local_d0[(long)pCVar20 * 8 + 6] = uVar14;
            local_d0[(long)pCVar20 * 8 + 7] = (uchar)local_d8;
          }
          pCVar20 = (ColorTree *)((long)pCVar20->children + 1);
          lVar18 = lVar18 + 6;
        } while (local_c8 != pCVar20);
      }
    }
    else if ((mode_out->bitdepth == 8) &&
            ((has_alpha = 1, mode_out->colortype == LCT_RGBA ||
             (has_alpha = 0, mode_out->colortype == LCT_RGB)))) {
      getPixelColorsRGBA8(local_d0,(size_t)local_c8,has_alpha,in,local_c0);
    }
    else {
      local_d2 = local_d2 & 0xff00;
      local_d4 = local_d4 & 0xff00;
      local_d6 = local_d6 & 0xff00;
      local_d8 = local_d8 & 0xff00;
      bVar21 = local_c8 == (ColorTree *)0x0;
      if (!bVar21) {
        lVar18 = 0;
        i = (ColorTree *)0x0;
        do {
          r_00 = &local_d2;
          a_00 = &local_d8;
          getPixelColorRGBA8((uchar *)r_00,(uchar *)&local_d4,(uchar *)&local_d6,(uchar *)a_00,in,
                             (size_t)i,local_c0);
          if (LCT_RGBA < mode_out->colortype) goto switchD_004e3bbd_caseD_1;
          switch(mode_out->colortype) {
          case LCT_GREY:
            uVar8 = mode_out->bitdepth;
            if (uVar8 == 0x10) {
              local_d0[(long)i * 2 + 1] = (byte)local_d2;
              local_d0[(long)i * 2] = (byte)local_d2;
            }
            else if (uVar8 == 8) {
              local_d0[(long)i] = (byte)local_d2;
            }
            else {
              bVar15 = (byte)uVar8;
              sVar4 = (bVar15 < 0x21) * (' ' - bVar15);
              addColorBits(local_d0,(size_t)i,uVar8,
                           ((uint)((byte)local_d2 >> ((byte)(8 - bVar15) & 0x1f)) << sVar4) >> sVar4
                          );
            }
            break;
          case LCT_RGB:
            if (mode_out->bitdepth == 8) {
              local_d0[lVar18] = (byte)local_d2;
              local_d0[lVar18 + 1] = (uchar)local_d4;
              local_d0[lVar18 + 2] = (uchar)local_d6;
            }
            else {
              local_d0[lVar18 * 2 + 1] = (byte)local_d2;
              local_d0[lVar18 * 2] = (byte)local_d2;
              local_d0[lVar18 * 2 + 3] = (uchar)local_d4;
              local_d0[lVar18 * 2 + 2] = (uchar)local_d4;
              local_d0[lVar18 * 2 + 5] = (uchar)local_d6;
              local_d0[lVar18 * 2 + 4] = (uchar)local_d6;
            }
            break;
          case LCT_PALETTE:
            uVar8 = color_tree_get((ColorTree *)local_b8,(byte)local_d2,(uchar)local_d4,
                                   (uchar)local_d6,(uchar)local_d8);
            if ((int)uVar8 < 0) {
              uVar8 = 0x52;
              bVar5 = false;
            }
            else {
              if (mode_out->bitdepth == 8) {
                local_d0[(long)i] = (uchar)uVar8;
              }
              else {
                addColorBits(local_d0,(size_t)i,mode_out->bitdepth,uVar8);
              }
              uVar8 = 0;
              bVar5 = true;
            }
            goto LAB_004e3d21;
          case LCT_GREY_ALPHA:
            if (mode_out->bitdepth == 0x10) {
              local_d0[(long)i * 4 + 1] = (byte)local_d2;
              local_d0[(long)i * 4] = (byte)local_d2;
              local_d0[(long)i * 4 + 3] = (uchar)local_d8;
              local_d0[(long)i * 4 + 2] = (uchar)local_d8;
            }
            else if (mode_out->bitdepth == 8) {
              local_d0[(long)i * 2] = (byte)local_d2;
              local_d0[(long)i * 2 + 1] = (uchar)local_d8;
            }
            break;
          case LCT_RGBA:
            if (mode_out->bitdepth == 8) {
              local_d0[(long)i * 4] = (byte)local_d2;
              local_d0[(long)i * 4 + 1] = (uchar)local_d4;
              local_d0[(long)i * 4 + 2] = (uchar)local_d6;
              local_d0[(long)i * 4 + 3] = (uchar)local_d8;
            }
            else {
              auVar3 = vpinsrb_avx(ZEXT416((uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),
                                                          (byte)local_d2)),
                                   (int)CONCAT71((int7)((ulong)extraout_RDX >> 8),(uchar)local_d4),1
                                  );
              auVar3 = vpinsrb_avx(auVar3,(int)CONCAT71((int7)((ulong)a_00 >> 8),(uchar)local_d6),2)
              ;
              auVar3 = vpinsrb_avx(auVar3,(int)CONCAT71((int7)((ulong)r_00 >> 8),(uchar)local_d8),3)
              ;
              auVar3 = vpunpcklbw_avx(auVar3,auVar3);
              *(long *)(local_d0 + (long)i * 8) = auVar3._0_8_;
            }
          }
switchD_004e3bbd_caseD_1:
          bVar5 = true;
          uVar8 = 0;
LAB_004e3d21:
          pCVar20 = (ColorTree *)((ulong)pCVar20 & 0xffffffff);
          if (!bVar5) {
            pCVar20 = (ColorTree *)(ulong)uVar8;
          }
          uVar8 = (uint)pCVar20;
          if (!bVar5) break;
          i = (ColorTree *)((long)i->children + 1);
          lVar18 = lVar18 + 3;
          bVar21 = local_c8 == i;
        } while (!bVar21);
      }
      if (!bVar21) {
        return uVar8;
      }
    }
    if (mode_out->colortype == LCT_PALETTE) {
      color_tree_cleanup((ColorTree *)local_b8);
    }
  }
  else {
    sVar9 = lodepng_get_raw_size(w,h,mode_in);
    if (sVar9 != 0) {
      sVar12 = 0;
      do {
        out[sVar12] = in[sVar12];
        sVar12 = sVar12 + 1;
      } while (sVar9 != sVar12);
    }
  }
  return 0;
}

Assistant:

unsigned lodepng_convert(unsigned char* out, const unsigned char* in,
                         const LodePNGColorMode* mode_out, const LodePNGColorMode* mode_in,
                         unsigned w, unsigned h)
{
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;

  if(lodepng_color_mode_equal(mode_out, mode_in))
  {
    size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
    for(i = 0; i != numbytes; ++i) out[i] = in[i];
    return 0;
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    size_t palettesize = mode_out->palettesize;
    const unsigned char* palette = mode_out->palette;
    size_t palsize = 1u << mode_out->bitdepth;
    /*if the user specified output palette but did not give the values, assume
    they want the values of the input color type (assuming that one is palette).
    Note that we never create a new palette ourselves.*/
    if(palettesize == 0)
    {
      palettesize = mode_in->palettesize;
      palette = mode_in->palette;
    }
    if(palettesize < palsize) palsize = palettesize;
    color_tree_init(&tree);
    for(i = 0; i != palsize; ++i)
    {
      const unsigned char* p = &palette[i * 4];
      color_tree_add(&tree, p[0], p[1], p[2], p[3], i);
    }
  }

  if(mode_in->bitdepth == 16 && mode_out->bitdepth == 16)
  {
    for(i = 0; i != numpixels; ++i)
    {
      unsigned short r = 0, g = 0, b = 0, a = 0;
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      rgba16ToPixel(out, i, mode_out, r, g, b, a);
    }
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGBA)
  {
    getPixelColorsRGBA8(out, numpixels, 1, in, mode_in);
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGB)
  {
    getPixelColorsRGBA8(out, numpixels, 0, in, mode_in);
  }
  else
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
      CERROR_TRY_RETURN(rgba8ToPixel(out, i, mode_out, &tree, r, g, b, a));
    }
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    color_tree_cleanup(&tree);
  }

  return 0; /*no error*/
}